

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip4-addr.c
# Opt level: O1

int run_test_ip4_addr(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  sockaddr_in addr;
  char dst [16];
  undefined1 auStack_28 [4];
  undefined1 local_24 [12];
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char cStack_9;
  
  pcVar3 = (char *)0x2;
  iVar1 = uv_inet_ntop(2,anon_var_dwarf_3ccec,&local_18,0x10);
  if (iVar1 == 0) {
    auVar4[0] = -(local_18 == '2');
    auVar4[1] = -(cStack_17 == '5');
    auVar4[2] = -(cStack_16 == '5');
    auVar4[3] = -(cStack_15 == '.');
    auVar4[4] = -(cStack_14 == '2');
    auVar4[5] = -(cStack_13 == '5');
    auVar4[6] = -(cStack_12 == '5');
    auVar4[7] = -(cStack_11 == '.');
    auVar4[8] = -(cStack_10 == '2');
    auVar4[9] = -(cStack_f == '5');
    auVar4[10] = -(cStack_e == '5');
    auVar4[0xb] = -(cStack_d == '.');
    auVar4[0xc] = -(cStack_c == '2');
    auVar4[0xd] = -(cStack_b == '5');
    auVar4[0xe] = -(cStack_a == '5');
    auVar4[0xf] = -(cStack_9 == '\0');
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00160e15;
    pcVar3 = (char *)0x2;
    iVar1 = uv_inet_ntop(2,anon_var_dwarf_3ccec,&local_18,0xf);
    if (iVar1 != -0x1c) goto LAB_00160e1a;
    pcVar3 = "127.0.0.1";
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_28);
    if (iVar1 != 0) goto LAB_00160e1f;
    pcVar3 = "255.255.255.255";
    iVar1 = uv_ip4_addr("255.255.255.255",0x23a3,auStack_28);
    if (iVar1 != 0) goto LAB_00160e24;
    pcVar3 = "255.255.255*000";
    iVar1 = uv_ip4_addr("255.255.255*000",0x23a3,auStack_28);
    if (iVar1 != -0x16) goto LAB_00160e29;
    pcVar3 = "255.255.255.256";
    iVar1 = uv_ip4_addr("255.255.255.256",0x23a3,auStack_28);
    if (iVar1 != -0x16) goto LAB_00160e2e;
    pcVar3 = "2555.0.0.0";
    iVar1 = uv_ip4_addr("2555.0.0.0",0x23a3,auStack_28);
    if (iVar1 != -0x16) goto LAB_00160e33;
    pcVar3 = "255";
    iVar1 = uv_ip4_addr("255",0x23a3,auStack_28);
    if (iVar1 != -0x16) goto LAB_00160e38;
    pcVar3 = (char *)0x2a;
    iVar1 = uv_inet_pton(0x2a,"127.0.0.1",local_24);
    if (iVar1 == -0x61) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00160e42;
    }
  }
  else {
    run_test_ip4_addr_cold_1();
LAB_00160e15:
    run_test_ip4_addr_cold_2();
LAB_00160e1a:
    run_test_ip4_addr_cold_3();
LAB_00160e1f:
    run_test_ip4_addr_cold_4();
LAB_00160e24:
    run_test_ip4_addr_cold_5();
LAB_00160e29:
    run_test_ip4_addr_cold_6();
LAB_00160e2e:
    run_test_ip4_addr_cold_7();
LAB_00160e33:
    run_test_ip4_addr_cold_8();
LAB_00160e38:
    run_test_ip4_addr_cold_9();
  }
  run_test_ip4_addr_cold_10();
LAB_00160e42:
  run_test_ip4_addr_cold_11();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(ip4_addr) {
  struct sockaddr_in addr;
  char dst[16];

  ASSERT(0 == uv_inet_ntop(AF_INET, "\xFF\xFF\xFF\xFF", dst, sizeof(dst)));
  ASSERT(0 == strcmp(dst, "255.255.255.255"));
  ASSERT(UV_ENOSPC == uv_inet_ntop(AF_INET, "\xFF\xFF\xFF\xFF",
                                   dst, sizeof(dst) - 1));

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_ip4_addr("255.255.255.255", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255.255.255*000", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255.255.255.256", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("2555.0.0.0", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255", TEST_PORT, &addr));

#ifdef SIN6_LEN
  ASSERT(addr.sin_len == sizeof(addr));
#endif

  /* for broken address family */
  ASSERT(UV_EAFNOSUPPORT == uv_inet_pton(42, "127.0.0.1",
    &addr.sin_addr.s_addr));

  MAKE_VALGRIND_HAPPY();
  return 0;
}